

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O0

Interaction * __thiscall pbrt::Transform::ApplyInverse(Transform *this,Interaction *in)

{
  undefined8 uVar1;
  long in_RDX;
  Interaction *in_RDI;
  type tVar2;
  float fVar3;
  undefined1 auVar8 [56];
  undefined1 auVar4 [64];
  undefined1 extraout_var [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar7 [64];
  Normal3<float> NVar9;
  Vector3<float> VVar10;
  Transform t;
  Interaction *ret;
  Point3fi *in_stack_00000368;
  Transform *in_stack_00000370;
  Interaction *n;
  Normal3<float> *in_stack_fffffffffffffed0;
  Interval<float> local_b0;
  Interval<float> IStack_a8;
  Interval<float> local_a0;
  Normal3<float> *in_stack_ffffffffffffffb8;
  Transform *in_stack_ffffffffffffffc0;
  
  n = in_RDI;
  Interaction::Interaction(in_RDI);
  Inverse((Transform *)&stack0xffffffffffffff68);
  operator()(in_stack_00000370,in_stack_00000368);
  (in_RDI->pi).super_Point3<pbrt::Interval<float>_>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z = local_a0;
  auVar8 = ZEXT856((ulong)IStack_a8);
  (in_RDI->pi).super_Point3<pbrt::Interval<float>_>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x = local_b0;
  (in_RDI->pi).super_Point3<pbrt::Interval<float>_>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y = IStack_a8;
  NVar9 = operator()(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  auVar4._0_8_ = NVar9.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar4._8_56_ = auVar8;
  uVar1 = vmovlpd_avx(auVar4._0_16_);
  (in_RDI->n).super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar1;
  (in_RDI->n).super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  (in_RDI->n).super_Tuple3<pbrt::Normal3,_float>.z = NVar9.super_Tuple3<pbrt::Normal3,_float>.z;
  tVar2 = LengthSquared<float>((Normal3<float> *)n);
  auVar8 = extraout_var;
  if (0.0 < tVar2) {
    NVar9 = Normalize<float>(in_stack_fffffffffffffed0);
    auVar5._0_8_ = NVar9.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    auVar5._8_56_ = auVar8;
    uVar1 = vmovlpd_avx(auVar5._0_16_);
    (in_RDI->n).super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar1;
    (in_RDI->n).super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
    (in_RDI->n).super_Tuple3<pbrt::Normal3,_float>.z = NVar9.super_Tuple3<pbrt::Normal3,_float>.z;
  }
  (in_RDI->uv).super_Tuple2<pbrt::Point2,_float> = *(Tuple2<pbrt::Point2,_float> *)(in_RDX + 0x34);
  VVar10 = operator()(in_stack_ffffffffffffffc0,(Vector3<float> *)in_stack_ffffffffffffffb8);
  auVar6._0_8_ = VVar10.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar6._8_56_ = auVar8;
  uVar1 = vmovlpd_avx(auVar6._0_16_);
  (in_RDI->wo).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (in_RDI->wo).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  (in_RDI->wo).super_Tuple3<pbrt::Vector3,_float>.z = VVar10.super_Tuple3<pbrt::Vector3,_float>.z;
  fVar3 = LengthSquared<float>(&in_RDI->wo);
  if (0.0 < fVar3) {
    auVar8 = extraout_var_00;
    VVar10 = Normalize<float>((Vector3<float> *)in_stack_fffffffffffffed0);
    auVar7._0_8_ = VVar10.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar7._8_56_ = auVar8;
    uVar1 = vmovlpd_avx(auVar7._0_16_);
    (in_RDI->wo).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
    (in_RDI->wo).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
    (in_RDI->wo).super_Tuple3<pbrt::Vector3,_float>.z = VVar10.super_Tuple3<pbrt::Vector3,_float>.z;
  }
  in_RDI->time = *(Float *)(in_RDX + 0x18);
  in_RDI->mediumInterface = *(MediumInterface **)(in_RDX + 0x40);
  return n;
}

Assistant:

Interaction Transform::ApplyInverse(const Interaction &in) const {
    Interaction ret;
    Transform t = Inverse(*this);
    ret.pi = t(in.pi);
    ret.n = t(in.n);
    if (LengthSquared(ret.n) > 0)
        ret.n = Normalize(ret.n);
    ret.uv = in.uv;
    ret.wo = t(in.wo);
    if (LengthSquared(ret.wo) > 0)
        ret.wo = Normalize(ret.wo);
    ret.time = in.time;
    ret.mediumInterface = in.mediumInterface;
    return ret;
}